

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-decoder-CH.cc
# Opt level: O2

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  pointer pvVar1;
  __type _Var2;
  ulong uVar3;
  pointer piVar4;
  size_type __new_size;
  pointer piVar5;
  int k;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_218;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_210;
  long local_208;
  Dict *local_200;
  Dict *local_1f8;
  string sep;
  string word;
  istringstream in;
  byte abStack_190 [352];
  
  local_218 = c;
  local_210 = l;
  local_200 = cd;
  local_1f8 = sd;
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)line,_S_in);
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sep,"|||",(allocator *)&k);
  uVar3 = 0;
  do {
    local_208 = uVar3 * 0x18;
LAB_001bffef:
    if ((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) {
LAB_001c0152:
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::istringstream::~istringstream((istringstream *)&in);
      return;
    }
    std::operator>>((istream *)&in,(string *)&word);
    if ((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) goto LAB_001c0152;
    _Var2 = std::operator==(&word,&sep);
    if (!_Var2) {
      if (uVar3 == 0) {
        *total = *total + 1;
        normalize_digital_lower(&word);
        k = cnn::Dict::Convert(local_1f8,&word);
        if (k == kUNK) {
          *unk = *unk + 1;
        }
        std::vector<int,_std::allocator<int>_>::push_back(s,&k);
      }
      else {
        piVar4 = (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
        piVar5 = (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        __new_size = (long)piVar4 - (long)piVar5 >> 2;
        if (__new_size < uVar3) {
          if (__new_size + 1 == uVar3) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(local_210,__new_size);
            piVar5 = (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          pvVar1 = (local_210->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          k = cnn::Dict::Convert(ld,&word);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&pvVar1[(ulong)~((long)piVar4 - (long)piVar5) >> 2].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + local_208),&k);
        }
        else {
          if (uVar3 == 1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(local_218,__new_size);
          }
          pvVar1 = (local_218->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          k = cnn::Dict::Convert(local_200,&word);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + local_208),&k);
        }
      }
      goto LAB_001bffef;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >& c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }

    if(f == 0) {
      total += 1;
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else if( f <= s->size()){
       if(f == 1) c.resize(s->size());
       c[f-1].push_back(cd->Convert(word));
    }
    else {
      if(f == s->size()+1) l.resize(s->size());
      l[f-(s->size())-1].push_back(ld->Convert(word));
    }
  }
}